

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle_decoder.cpp
# Opt level: O2

void __thiscall duckdb::RLEDecoder::InitializePage(RLEDecoder *this)

{
  pointer __p;
  ResizeableBuffer *pRVar1;
  ResizeableBuffer *pRVar2;
  runtime_error *this_00;
  shared_ptr<duckdb::ResizeableBuffer,_true> *this_01;
  int local_24;
  pointer local_20;
  
  if (this->reader->column_schema->type == (LogicalType)0xa) {
    this_01 = &this->reader->block;
    pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
    ByteBuffer::inc(&pRVar1->super_ByteBuffer,4);
    pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
    pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_01);
    local_24 = 1;
    make_uniq<duckdb::RleBpDecoder,unsigned_char*&,unsigned_long&,int>
              ((duckdb *)&local_20,(uchar **)pRVar1,&(pRVar2->super_ByteBuffer).len,&local_24);
    __p = local_20;
    local_20 = (pointer)0x0;
    std::__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::reset
              ((__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_> *)
               &this->rle_decoder,__p);
    std::unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::~unique_ptr
              ((unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_> *)
               &local_20);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"RLE encoding is only supported for boolean data");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void RLEDecoder::InitializePage() {
	if (reader.Type().id() != LogicalTypeId::BOOLEAN) {
		throw std::runtime_error("RLE encoding is only supported for boolean data");
	}
	auto &block = reader.block;
	block->inc(sizeof(uint32_t));
	rle_decoder = make_uniq<RleBpDecoder>(block->ptr, block->len, 1);
}